

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O3

void __thiscall
nigel::BuilderExecutable::generateNotification
          (BuilderExecutable *this,NT error,shared_ptr<nigel::Token> *token)

{
  size_t *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _List_node_base *p_Var3;
  undefined1 local_29;
  CompileNotification *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  NT local_c;
  
  local_28 = (CompileNotification *)0x0;
  local_c = error;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::CompileNotification,std::allocator<nigel::CompileNotification>,nigel::CompileNotification::Type&,std::shared_ptr<nigel::Token>&>
            (a_Stack_20,&local_28,(allocator<nigel::CompileNotification> *)&local_29,&local_c,token)
  ;
  p_Var3 = (_List_node_base *)operator_new(0x20);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3[1]._M_next = (_List_node_base *)local_28;
  p_Var3[1]._M_prev = (_List_node_base *)_Var2._M_pi;
  local_28 = (CompileNotification *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->notificationList).
            super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return;
}

Assistant:

void BuilderExecutable::generateNotification( NT error, std::shared_ptr<Token> token )
	{
		notificationList.push_back( std::make_shared<CompileNotification>( error, token ) );
	}